

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScript(BinaryWriterSpec *this,Script *script)

{
  _Head_base<0UL,_wabt::Command_*,_false> _Var1;
  long lVar2;
  string_view filename;
  string_view filename_00;
  pointer puVar3;
  Action *action;
  ulong uVar4;
  string_view sVar5;
  undefined4 in_stack_ffffffffffffffa8;
  CommandType CVar6;
  _Alloc_hider in_stack_ffffffffffffffb0;
  size_type local_48;
  char local_40 [16];
  
  this->script_ = script;
  Stream::Writef(this->json_stream_,"{\"source_filename\": ");
  sVar5.data_ = (this->source_filename_)._M_dataplus._M_p;
  sVar5.size_ = (this->source_filename_)._M_string_length;
  WriteEscapedString(this,sVar5);
  Stream::Writef(this->json_stream_,",\n \"commands\": [\n");
  puVar3 = (this->script_->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->script_->commands).
      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    CVar6 = ~First;
    uVar4 = 0;
    do {
      _Var1._M_head_impl =
           puVar3[uVar4]._M_t.
           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
           super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      if (uVar4 != 0) {
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\n");
      }
      Stream::Writef(this->json_stream_,"  {");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      Stream::Writef(this->json_stream_,"\"%s\"",
                     _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                     + *(int *)(
                               _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                               + (long)(int)(_Var1._M_head_impl)->type * 4));
      Stream::Writef(this->json_stream_,", ");
      switch((_Var1._M_head_impl)->type) {
      case First:
        (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,this,kWasmExtension);
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)&_Var1._M_head_impl[2]._vptr_Command)
        ;
        Stream::Writef(this->json_stream_,", ");
        if (*(long *)((long)(_Var1._M_head_impl + 3) + 8) != 0) {
          Stream::Writef(this->json_stream_,"\"%s\": ","name");
          WriteEscapedString(this,(string_view)_Var1._M_head_impl[3]);
          Stream::Writef(this->json_stream_,", ");
        }
        Stream::Writef(this->json_stream_,"\"%s\": ","filename");
        filename.data_._4_4_ = CVar6;
        filename.data_._0_4_ = in_stack_ffffffffffffffa8;
        filename.size_ = (size_type)in_stack_ffffffffffffffb0._M_p;
        sVar5 = GetBasename(filename);
        WriteEscapedString(this,sVar5);
        filename_00.size_ = local_48;
        filename_00.data_ = in_stack_ffffffffffffffb0._M_p;
        WriteModule(this,filename_00,(Module *)(_Var1._M_head_impl + 1));
        this->num_modules_ = this->num_modules_ + 1;
        if (in_stack_ffffffffffffffb0._M_p != local_40) {
          operator_delete(in_stack_ffffffffffffffb0._M_p);
        }
        CVar6 = (CommandType)uVar4;
        break;
      case Action:
        action = (Action *)_Var1._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)(uint)(action->loc).field_1.field_0.line);
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,action);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","expected");
        goto LAB_0014345e;
      case Register:
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)&_Var1._M_head_impl[4]._vptr_Command)
        ;
        Stream::Writef(this->json_stream_,", ");
        if (*(int *)&_Var1._M_head_impl[5]._vptr_Command == 0) {
          if (*(CommandType *)((long)(_Var1._M_head_impl + 5) + 8) != CVar6) {
            __assert_fail("var.index() == last_module_index",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                          ,0x1f6,
                          "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommands()");
          }
        }
        else {
          if (*(int *)&_Var1._M_head_impl[5]._vptr_Command != 1) {
            __assert_fail("is_index()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                          ,0x38,"Index wabt::Var::index() const");
          }
          Stream::Writef(this->json_stream_,"\"%s\": ","name");
          WriteVar(this,(Var *)(_Var1._M_head_impl + 3));
          Stream::Writef(this->json_stream_,", ");
        }
        Stream::Writef(this->json_stream_,"\"%s\": ","as");
        WriteEscapedString(this,(string_view)_Var1._M_head_impl[1]);
        break;
      case AssertMalformed:
      case AssertInvalid:
      case AssertUnlinkable:
      case AssertUninstantiable:
        WriteInvalidModule(this,(ScriptModule *)_Var1._M_head_impl[1]._vptr_Command,
                           *(string_view *)((long)(_Var1._M_head_impl + 1) + 8));
        this->num_modules_ = this->num_modules_ + 1;
        break;
      case AssertReturn:
        lVar2 = (long)_Var1._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(lVar2 + 0x18));
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,(Action *)_Var1._M_head_impl[1]._vptr_Command);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","expected");
        WriteConstVector(this,(ConstVector *)((long)(_Var1._M_head_impl + 1) + 8));
        break;
      case AssertTrap:
      case AssertExhaustion:
        lVar2 = (long)_Var1._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(lVar2 + 0x18));
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,(Action *)_Var1._M_head_impl[1]._vptr_Command);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","text");
        WriteEscapedString(this,*(string_view *)((long)(_Var1._M_head_impl + 1) + 8));
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","expected");
        action = (Action *)_Var1._M_head_impl[1]._vptr_Command;
LAB_0014345e:
        WriteActionResultType(this,action);
      }
      Stream::Writef(this->json_stream_,"}");
      uVar4 = uVar4 + 1;
      puVar3 = (this->script_->commands).
               super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->script_->commands).
                                   super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  Stream::Writef(this->json_stream_,"]}\n");
  return (Result)(this->result_).enum_;
}

Assistant:

Result BinaryWriterSpec::WriteScript(const Script& script) {
  script_ = &script;
  WriteCommands();
  return result_;
}